

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int coda_XML_SetHashSalt(XML_Parser parser,unsigned_long hash_salt)

{
  unsigned_long hash_salt_local;
  XML_Parser parser_local;
  
  if (parser == (XML_Parser)0x0) {
    parser_local._4_4_ = 0;
  }
  else if (parser->m_parentParser == (XML_Parser)0x0) {
    if (((parser->m_parsingStatus).parsing == XML_PARSING) ||
       ((parser->m_parsingStatus).parsing == XML_SUSPENDED)) {
      parser_local._4_4_ = 0;
    }
    else {
      parser->m_hash_secret_salt = hash_salt;
      parser_local._4_4_ = 1;
    }
  }
  else {
    parser_local._4_4_ = coda_XML_SetHashSalt(parser->m_parentParser,hash_salt);
  }
  return parser_local._4_4_;
}

Assistant:

int XMLCALL
XML_SetHashSalt(XML_Parser parser, unsigned long hash_salt) {
  if (parser == NULL)
    return 0;
  if (parser->m_parentParser)
    return XML_SetHashSalt(parser->m_parentParser, hash_salt);
  /* block after XML_Parse()/XML_ParseBuffer() has been called */
  if (parser->m_parsingStatus.parsing == XML_PARSING
      || parser->m_parsingStatus.parsing == XML_SUSPENDED)
    return 0;
  parser->m_hash_secret_salt = hash_salt;
  return 1;
}